

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

Graph * __thiscall
spoa::Graph::Subgraph
          (Graph *__return_storage_ptr__,Graph *this,uint32_t begin,uint32_t end,
          vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>
          *subgraph_to_graph)

{
  uint uVar1;
  pointer puVar2;
  pointer ppEVar3;
  Node *head;
  pointer ppNVar4;
  Node *pNVar5;
  invalid_argument *this_00;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it;
  pointer puVar6;
  Edge **kt;
  pointer ppEVar7;
  pointer ppNVar8;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> graph_to_subgraph;
  allocator_type local_79;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> local_78;
  vector<bool,_std::allocator<bool>_> local_60;
  value_type local_38;
  
  if (subgraph_to_graph !=
      (vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)0x0) {
    puVar6 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ExtractSubgraph(&local_60,this,
                    (Node *)puVar6[end]._M_t.
                            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                            ._M_t,
                    (Node *)puVar6[begin]._M_t.
                            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                            ._M_t);
    Graph(__return_storage_ptr__);
    __return_storage_ptr__->num_codes_ = this->num_codes_;
    std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->coder_,&this->coder_)
    ;
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->decoder_,&this->decoder_);
    if (*(long *)(subgraph_to_graph + 8) != *(long *)subgraph_to_graph) {
      *(long *)(subgraph_to_graph + 8) = *(long *)subgraph_to_graph;
    }
    local_78.super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::resize
              (subgraph_to_graph,
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)&local_78);
    local_38 = (value_type)0x0;
    std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::vector
              (&local_78,
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes_).
                     super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_38,&local_79);
    puVar6 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar6 != puVar2) {
      do {
        pNVar5 = (puVar6->_M_t).
                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        uVar1 = pNVar5->id;
        if ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)
        {
          AddNode(__return_storage_ptr__,pNVar5->code);
          local_78.super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start
          [((puVar6->_M_t).
            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
            super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
            super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id] =
               (__return_storage_ptr__->nodes_).
               super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
               _M_t.
               super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
               super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
          *(Node **)(*(long *)subgraph_to_graph +
                    (ulong)((__return_storage_ptr__->nodes_).
                            super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                            .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id * 8
                    ) = (puVar6->_M_t).
                        super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                        .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar2);
      puVar2 = (this->nodes_).
               super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = (this->nodes_).
                    super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1
          ) {
        pNVar5 = (puVar6->_M_t).
                 super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                 .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        uVar1 = pNVar5->id;
        if ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)
        {
          ppEVar7 = *(pointer *)
                     &(pNVar5->inedges).
                      super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                      _M_impl;
          ppEVar3 = *(pointer *)
                     ((long)&(pNVar5->inedges).
                             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                     + 8);
          head = local_78.
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar1];
          if (ppEVar7 != ppEVar3) {
            do {
              if (local_78.
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(*ppEVar7)->tail->id] != (Node *)0x0) {
                AddEdge(__return_storage_ptr__,
                        local_78.
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[(*ppEVar7)->tail->id],head,
                        (uint32_t)(*ppEVar7)->weight);
              }
              ppEVar7 = ppEVar7 + 1;
            } while (ppEVar7 != ppEVar3);
            pNVar5 = (puVar6->_M_t).
                     super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>
                     .super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
          }
          ppNVar8 = (pNVar5->aligned_nodes).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppNVar4 = *(pointer *)
                     ((long)&(pNVar5->aligned_nodes).
                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             ._M_impl + 8);
          if (ppNVar8 != ppNVar4) {
            do {
              if (local_78.
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(*ppNVar8)->id] != (Node *)0x0) {
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &head->aligned_nodes,
                           local_78.
                           super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + (*ppNVar8)->id);
              }
              ppNVar8 = ppNVar8 + 1;
            } while (ppNVar8 != ppNVar4);
          }
        }
      }
    }
    TopologicalSort(__return_storage_ptr__);
    if (local_78.super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[spoa::Graph::Subgraph] error: invalid ptr to subgraph_to_graph");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Graph Graph::Subgraph(
    std::uint32_t begin,
    std::uint32_t end,
    std::vector<const Node*>* subgraph_to_graph) const {
  if (!subgraph_to_graph) {
    throw std::invalid_argument(
        "[spoa::Graph::Subgraph] error: invalid ptr to subgraph_to_graph");
  }

  auto is_in_subgraph = ExtractSubgraph(nodes_[end].get(), nodes_[begin].get());

  // init subgraph
  Graph subgraph{};
  subgraph.num_codes_ = num_codes_;
  subgraph.coder_ = coder_;
  subgraph.decoder_ = decoder_;
  // subgraph.sequences_ = TODO(rvaser) maybe add sequences

  // create a map from subgraph nodes to graph nodes and vice versa
  subgraph_to_graph->clear();
  subgraph_to_graph->resize(nodes_.size(), nullptr);

  std::vector<Node*> graph_to_subgraph(nodes_.size(), nullptr);

  for (const auto& it : nodes_) {
    if (!is_in_subgraph[it->id]) {
      continue;
    }
    subgraph.AddNode(it->code);
    graph_to_subgraph[it->id] = subgraph.nodes_.back().get();
    (*subgraph_to_graph)[subgraph.nodes_.back()->id] = it.get();
  }

  // connect nodes
  for (const auto& it : nodes_) {
    if (!is_in_subgraph[it->id]) {
      continue;
    }
    auto jt = graph_to_subgraph[it->id];
    for (const auto& kt : it->inedges) {
      if (graph_to_subgraph[kt->tail->id]) {
        subgraph.AddEdge(graph_to_subgraph[kt->tail->id], jt, kt->weight);
      }
    }
    for (const auto& kt : it->aligned_nodes) {
      if (graph_to_subgraph[kt->id]) {
        jt->aligned_nodes.emplace_back(graph_to_subgraph[kt->id]);
      }
    }
  }

  subgraph.TopologicalSort();

  return subgraph;
}